

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

char * jsonnet_evaluate_snippet_stream(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_evaluate_snippet_aux(vm,filename,snippet,error,STREAM);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_snippet_stream(JsonnetVm *vm, const char *filename, const char *snippet,
                                      int *error)
{
    TRY
        return jsonnet_evaluate_snippet_aux(vm, filename, snippet, error, STREAM);
    CATCH("jsonnet_evaluate_snippet_stream")
    return nullptr;  // Never happens.
}